

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int databaseIsUnmoved(Pager *pPager)

{
  int iVar1;
  int iVar2;
  int bHasMoved;
  int local_c;
  
  local_c = 0;
  iVar2 = 0;
  if (((pPager->tempFile == '\0') && (iVar2 = 0, pPager->dbSize != 0)) &&
     (iVar1 = (*pPager->fd->pMethods->xFileControl)(pPager->fd,0x14,&local_c), iVar1 != 0xc)) {
    iVar2 = 0x408;
    if (local_c == 0) {
      iVar2 = iVar1;
    }
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int databaseIsUnmoved(Pager *pPager){
  int bHasMoved = 0;
  int rc;

  if( pPager->tempFile ) return SQLITE_OK;
  if( pPager->dbSize==0 ) return SQLITE_OK;
  assert( pPager->zFilename && pPager->zFilename[0] );
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_HAS_MOVED, &bHasMoved);
  if( rc==SQLITE_NOTFOUND ){
    /* If the HAS_MOVED file-control is unimplemented, assume that the file
    ** has not been moved.  That is the historical behavior of SQLite: prior to
    ** version 3.8.3, it never checked */
    rc = SQLITE_OK;
  }else if( rc==SQLITE_OK && bHasMoved ){
    rc = SQLITE_READONLY_DBMOVED;
  }
  return rc;
}